

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetItemDefaultFocus(void)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  if ((((window->Appearing == true) && (GImGui->NavWindow == window->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || ((GImGui->NavInitResult).ID != 0)))) &&
     (GImGui->NavLayer == (window->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    NavApplyItemToResult(&pIVar1->NavInitResult);
    bVar2 = true;
    if (GImGui->NavMoveScoringItems == false) {
      bVar2 = GImGui->NavInitRequest;
    }
    GImGui->NavAnyRequest = bVar2;
    if (((((pIVar1->LastItemData).Rect.Min.x < (window->ClipRect).Min.x) ||
         ((pIVar1->LastItemData).Rect.Min.y < (window->ClipRect).Min.y)) ||
        ((window->ClipRect).Max.x < (pIVar1->LastItemData).Rect.Max.x)) ||
       ((window->ClipRect).Max.y < (pIVar1->LastItemData).Rect.Max.y)) {
      ScrollToRectEx(window,&(pIVar1->LastItemData).Rect,0);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow != window->RootWindowForNav || (!g.NavInitRequest && g.NavInitResult.ID == 0) || g.NavLayer != window->DC.NavLayerCurrent)
        return;

    g.NavInitRequest = false;
    NavApplyItemToResult(&g.NavInitResult);
    NavUpdateAnyRequestFlag();

    // Scroll could be done in NavInitRequestApplyResult() via an opt-in flag (we however don't want regular init requests to scroll)
    if (!window->ClipRect.Contains(g.LastItemData.Rect))
        ScrollToRectEx(window, g.LastItemData.Rect, ImGuiScrollFlags_None);
}